

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  value_type *pvVar1;
  value_type *ppIVar2;
  int local_18;
  int local_14;
  int i_1;
  int i;
  ImFontAtlas *this_local;
  
  for (local_14 = 0; local_14 < (this->ConfigData).Size; local_14 = local_14 + 1) {
    pvVar1 = ImVector<ImFontConfig>::operator[](&this->ConfigData,local_14);
    if (pvVar1->FontData != (void *)0x0) {
      pvVar1 = ImVector<ImFontConfig>::operator[](&this->ConfigData,local_14);
      if ((pvVar1->FontDataOwnedByAtlas & 1U) != 0) {
        pvVar1 = ImVector<ImFontConfig>::operator[](&this->ConfigData,local_14);
        ImGui::MemFree(pvVar1->FontData);
        pvVar1 = ImVector<ImFontConfig>::operator[](&this->ConfigData,local_14);
        pvVar1->FontData = (void *)0x0;
      }
    }
  }
  for (local_18 = 0; local_18 < (this->Fonts).Size; local_18 = local_18 + 1) {
    ppIVar2 = ImVector<ImFont_*>::operator[](&this->Fonts,local_18);
    if ((this->ConfigData).Data <= (*ppIVar2)->ConfigData) {
      ppIVar2 = ImVector<ImFont_*>::operator[](&this->Fonts,local_18);
      if ((*ppIVar2)->ConfigData < (this->ConfigData).Data + (this->ConfigData).Size) {
        ppIVar2 = ImVector<ImFont_*>::operator[](&this->Fonts,local_18);
        (*ppIVar2)->ConfigData = (ImFontConfig *)0x0;
        ppIVar2 = ImVector<ImFont_*>::operator[](&this->Fonts,local_18);
        (*ppIVar2)->ConfigDataCount = 0;
      }
    }
  }
  ImVector<ImFontConfig>::clear(&this->ConfigData);
  return;
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            ImGui::MemFree(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
}